

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void __thiscall ot::commissioner::Error::~Error(Error *this)

{
  Error *this_local;
  
  std::__cxx11::string::~string((string *)&this->mMessage);
  return;
}

Assistant:

class OT_COMM_MUST_USE_RESULT Error
{
public:
    /**
     * The default error is none error.
     *
     */
    Error()
        : mCode(ErrorCode::kNone)
    {
    }

    /**
     * Creates a error with the specified error code and message as a
     * human-readable string containing more detailed information.
     *
     */
    Error(ErrorCode aErrorCode, const std::string &aErrorMessage)
        : mCode(aErrorCode)
        , mMessage(aErrorMessage)
    {
    }

    // Copy the specified error.
    Error(const Error &aError);
    Error &operator=(const Error &aError);
    Error(Error &&aError) noexcept;
    Error &operator=(Error &&aError) noexcept;

    /**
     * Two errors are considered equal when their error codes are equal.
     *
     */
    bool operator==(const Error &aOther) const { return GetCode() == aOther.GetCode(); }
    bool operator!=(const Error &aOther) const { return !(*this == aOther); }

    ErrorCode GetCode() const { return mCode; }

    const std::string &GetMessage() const { return mMessage; }

    /**
     * Returns a string representation of this error suitable for
     * printing. Returns the string `"OK"` for success.
     *
     */
    std::string ToString() const;

    /**
     * Ignores any errors. This method does nothing except potentially suppress
     * complaints from any tools that are checking that errors are not dropped on
     * the floor.
     *
     */
    void IgnoreError() const {}

private:
    ErrorCode   mCode;
    std::string mMessage;
}